

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O3

LinkInterfaceLibraries * __thiscall
cmTarget::GetLinkInterfaceLibraries
          (cmTarget *this,string *config,cmTarget *head,bool usage_requirements_only)

{
  _Base_ptr p_Var1;
  bool bVar2;
  LinkInterface *pLVar3;
  map<const_cmTarget_*,_cmTargetInternals::OptionalLinkInterface,_std::less<const_cmTarget_*>,_std::allocator<std::pair<const_cmTarget_*const,_cmTargetInternals::OptionalLinkInterface>_>_>
  *this_00;
  mapped_type *iface;
  long lVar4;
  mapped_type *pmVar5;
  string CONFIG;
  cmTarget *local_50;
  string local_48;
  
  local_50 = head;
  if (this->IsImportedTarget != true) {
    if ((this->TargetTypeValue != EXECUTABLE) || (bVar2 = IsExecutableWithExports(this), bVar2)) {
      cmsys::SystemTools::UpperCase(&local_48,config);
      lVar4 = 0x30;
      if (usage_requirements_only) {
        lVar4 = 0x60;
      }
      this_00 = &std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetInternals::HeadToLinkInterfaceMap,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetInternals::HeadToLinkInterfaceMap>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetInternals::HeadToLinkInterfaceMap,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetInternals::HeadToLinkInterfaceMap>_>_>
                               *)((long)&(((this->Internal).Pointer)->Backtrace).
                                         super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>
                                         .
                                         super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>
                                         ._M_impl.super__Vector_impl_data._M_start + lVar4),
                              &local_48)->
                 super_map<const_cmTarget_*,_cmTargetInternals::OptionalLinkInterface,_std::less<const_cmTarget_*>,_std::allocator<std::pair<const_cmTarget_*const,_cmTargetInternals::OptionalLinkInterface>_>_>
      ;
      if (((this_00->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0) ||
         (p_Var1 = (this_00->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
         *(char *)((long)&p_Var1[4]._M_left + 4) != '\0')) {
        iface = std::
                map<const_cmTarget_*,_cmTargetInternals::OptionalLinkInterface,_std::less<const_cmTarget_*>,_std::allocator<std::pair<const_cmTarget_*const,_cmTargetInternals::OptionalLinkInterface>_>_>
                ::operator[](this_00,&local_50);
        if ((iface->super_LinkInterface).field_0x69 == '\0') {
          (iface->super_LinkInterface).field_0x69 = 1;
          cmTargetInternals::ComputeLinkInterfaceLibraries
                    ((this->Internal).Pointer,this,config,iface,local_50,usage_requirements_only);
        }
        pmVar5 = (mapped_type *)0x0;
        if ((iface->super_LinkInterface).field_0x6b != '\0') {
          pmVar5 = iface;
        }
      }
      else {
        pmVar5 = (mapped_type *)&p_Var1[1]._M_parent;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      pmVar5 = (mapped_type *)0x0;
    }
    return (LinkInterfaceLibraries *)pmVar5;
  }
  pLVar3 = GetImportLinkInterface(this,config,head,usage_requirements_only);
  return &pLVar3->super_LinkInterfaceLibraries;
}

Assistant:

cmTarget::LinkInterfaceLibraries const*
cmTarget::GetLinkInterfaceLibraries(const std::string& config,
                                    cmTarget const* head,
                                    bool usage_requirements_only) const
{
  // Imported targets have their own link interface.
  if(this->IsImported())
    {
    return this->GetImportLinkInterface(config, head, usage_requirements_only);
    }

  // Link interfaces are not supported for executables that do not
  // export symbols.
  if(this->GetType() == cmTarget::EXECUTABLE &&
     !this->IsExecutableWithExports())
    {
    return 0;
    }

  // Lookup any existing link interface for this configuration.
  std::string CONFIG = cmSystemTools::UpperCase(config);
  cmTargetInternals::HeadToLinkInterfaceMap& hm =
    (usage_requirements_only ?
     this->Internal->LinkInterfaceUsageRequirementsOnlyMap[CONFIG] :
     this->Internal->LinkInterfaceMap[CONFIG]);

  // If the link interface does not depend on the head target
  // then return the one we computed first.
  if(!hm.empty() && !hm.begin()->second.HadHeadSensitiveCondition)
    {
    return &hm.begin()->second;
    }

  cmTargetInternals::OptionalLinkInterface& iface = hm[head];
  if(!iface.LibrariesDone)
    {
    iface.LibrariesDone = true;
    this->Internal->ComputeLinkInterfaceLibraries(
      this, config, iface, head, usage_requirements_only);
    }

  return iface.Exists? &iface : 0;
}